

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Music_Emu.cpp
# Opt level: O2

void __thiscall Music_Emu::fill_buf(Music_Emu *this)

{
  long lVar1;
  
  if (this->emu_track_ended_ == false) {
    emu_play(this,0x800,(this->buf).begin_);
    lVar1 = count_silence((this->buf).begin_,0x800);
    if (lVar1 < 0x800) {
      this->silence_time = this->emu_time - lVar1;
      this->buf_remain = 0x800;
      return;
    }
  }
  this->silence_count = this->silence_count + 0x800;
  return;
}

Assistant:

void Music_Emu::fill_buf()
{
	assert( !buf_remain );
	if ( !emu_track_ended_ )
	{
		emu_play( buf_size, buf.begin() );
		long silence = count_silence( buf.begin(), buf_size );
		if ( silence < buf_size )
		{
			silence_time = emu_time - silence;
			buf_remain   = buf_size;
			return;
		}
	}
	silence_count += buf_size;
}